

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void test_schnorrsig_bip_vectors_check_signing
               (uchar *sk,uchar *pk_serialized,uchar *aux_rand,uchar *msg,size_t msglen,
               uchar *expected_sig)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  secp256k1_schnorrsig_extraparams local_168;
  uchar sig [64];
  secp256k1_xonly_pubkey pk;
  secp256k1_keypair keypair;
  secp256k1_xonly_pubkey pk_expected;
  
  local_168.magic[0] = 0xda;
  local_168.magic[1] = 'o';
  local_168.magic[2] = 0xb3;
  local_168.magic[3] = 0x8c;
  local_168._4_4_ = 0;
  local_168.noncefp = (secp256k1_nonce_function_hardened)0x0;
  local_168.ndata = aux_rand;
  iVar1 = secp256k1_keypair_create(CTX,&keypair,sk);
  if (iVar1 == 0) {
    pcVar3 = "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk)";
    uVar2 = 0xb4;
  }
  else {
    iVar1 = secp256k1_schnorrsig_sign_custom(CTX,sig,msg,msglen,&keypair,&local_168);
    if (iVar1 == 0) {
      pcVar3 = 
      "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, msglen, &keypair, &extraparams)"
      ;
      uVar2 = 0xb5;
    }
    else {
      iVar1 = secp256k1_memcmp_var(sig,expected_sig,0x40);
      if (iVar1 == 0) {
        if (msglen == 0x20) {
          sig[0x30] = '\0';
          sig[0x31] = '\0';
          sig[0x32] = '\0';
          sig[0x33] = '\0';
          sig[0x34] = '\0';
          sig[0x35] = '\0';
          sig[0x36] = '\0';
          sig[0x37] = '\0';
          sig[0x38] = '\0';
          sig[0x39] = '\0';
          sig[0x3a] = '\0';
          sig[0x3b] = '\0';
          sig[0x3c] = '\0';
          sig[0x3d] = '\0';
          sig[0x3e] = '\0';
          sig[0x3f] = '\0';
          sig[0x20] = '\0';
          sig[0x21] = '\0';
          sig[0x22] = '\0';
          sig[0x23] = '\0';
          sig[0x24] = '\0';
          sig[0x25] = '\0';
          sig[0x26] = '\0';
          sig[0x27] = '\0';
          sig[0x28] = '\0';
          sig[0x29] = '\0';
          sig[0x2a] = '\0';
          sig[0x2b] = '\0';
          sig[0x2c] = '\0';
          sig[0x2d] = '\0';
          sig[0x2e] = '\0';
          sig[0x2f] = '\0';
          sig[0x10] = '\0';
          sig[0x11] = '\0';
          sig[0x12] = '\0';
          sig[0x13] = '\0';
          sig[0x14] = '\0';
          sig[0x15] = '\0';
          sig[0x16] = '\0';
          sig[0x17] = '\0';
          sig[0x18] = '\0';
          sig[0x19] = '\0';
          sig[0x1a] = '\0';
          sig[0x1b] = '\0';
          sig[0x1c] = '\0';
          sig[0x1d] = '\0';
          sig[0x1e] = '\0';
          sig[0x1f] = '\0';
          sig[0] = '\0';
          sig[1] = '\0';
          sig[2] = '\0';
          sig[3] = '\0';
          sig[4] = '\0';
          sig[5] = '\0';
          sig[6] = '\0';
          sig[7] = '\0';
          sig[8] = '\0';
          sig[9] = '\0';
          sig[10] = '\0';
          sig[0xb] = '\0';
          sig[0xc] = '\0';
          sig[0xd] = '\0';
          sig[0xe] = '\0';
          sig[0xf] = '\0';
          iVar1 = secp256k1_schnorrsig_sign32(CTX,sig,msg,&keypair,aux_rand);
          if (iVar1 == 0) {
            pcVar3 = 
            "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, aux_rand)";
            uVar2 = 0xb9;
            goto LAB_0013c651;
          }
          iVar1 = secp256k1_memcmp_var(sig,expected_sig,0x40);
          if (iVar1 != 0) {
            pcVar3 = "test condition failed: secp256k1_memcmp_var(sig, expected_sig, 64) == 0";
            uVar2 = 0xba;
            goto LAB_0013c651;
          }
        }
        iVar1 = secp256k1_xonly_pubkey_parse(CTX,&pk_expected,pk_serialized);
        if (iVar1 == 0) {
          pcVar3 = 
          "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &pk_expected, pk_serialized)";
          uVar2 = 0xbd;
        }
        else {
          iVar1 = secp256k1_keypair_xonly_pub(CTX,&pk,(int *)0x0,&keypair);
          if (iVar1 == 0) {
            pcVar3 = "test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair)";
            uVar2 = 0xbe;
          }
          else {
            iVar1 = secp256k1_memcmp_var(&pk,&pk_expected,0x40);
            if (iVar1 == 0) {
              iVar1 = secp256k1_schnorrsig_verify(CTX,sig,msg,msglen,&pk);
              if (iVar1 != 0) {
                return;
              }
              pcVar3 = 
              "test condition failed: secp256k1_schnorrsig_verify(CTX, sig, msg, msglen, &pk)";
              uVar2 = 0xc0;
            }
            else {
              pcVar3 = 
              "test condition failed: secp256k1_memcmp_var(&pk, &pk_expected, sizeof(pk)) == 0";
              uVar2 = 0xbf;
            }
          }
        }
      }
      else {
        pcVar3 = "test condition failed: secp256k1_memcmp_var(sig, expected_sig, 64) == 0";
        uVar2 = 0xb6;
      }
    }
  }
LAB_0013c651:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void test_schnorrsig_bip_vectors_check_signing(const unsigned char *sk, const unsigned char *pk_serialized, const unsigned char *aux_rand, const unsigned char *msg, size_t msglen, const unsigned char *expected_sig) {
    unsigned char sig[64];
    secp256k1_keypair keypair;
    secp256k1_xonly_pubkey pk, pk_expected;

    secp256k1_schnorrsig_extraparams extraparams = SECP256K1_SCHNORRSIG_EXTRAPARAMS_INIT;
    extraparams.ndata = (unsigned char*)aux_rand;

    CHECK(secp256k1_keypair_create(CTX, &keypair, sk));
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, msg, msglen, &keypair, &extraparams));
    CHECK(secp256k1_memcmp_var(sig, expected_sig, 64) == 0);
    if (msglen == 32) {
        memset(sig, 0, 64);
        CHECK(secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, aux_rand));
        CHECK(secp256k1_memcmp_var(sig, expected_sig, 64) == 0);
    }

    CHECK(secp256k1_xonly_pubkey_parse(CTX, &pk_expected, pk_serialized));
    CHECK(secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair));
    CHECK(secp256k1_memcmp_var(&pk, &pk_expected, sizeof(pk)) == 0);
    CHECK(secp256k1_schnorrsig_verify(CTX, sig, msg, msglen, &pk));
}